

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void kwssys::SystemToolsStatic::ReplaceString
               (string *source,char *replace,size_t replaceSize,string *with)

{
  char *__haystack;
  char *pcVar1;
  char *__ptr;
  string *in_RCX;
  long in_RDX;
  char *in_RSI;
  string *in_RDI;
  char *currentPos;
  char *orig;
  char *searchPos;
  char *src;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string *this;
  undefined8 local_58;
  undefined8 local_48;
  char *local_40;
  char *local_30;
  
  __haystack = (char *)std::__cxx11::string::c_str();
  pcVar1 = strstr(__haystack,in_RSI);
  if (pcVar1 != (char *)0x0) {
    __ptr = strdup(__haystack);
    local_30 = __ptr + ((long)pcVar1 - (long)__haystack);
    this = in_RDI;
    std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,in_stack_ffffffffffffff88);
    std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,in_stack_ffffffffffffff88);
    std::__cxx11::string::erase(this,local_48,local_58);
    local_40 = __ptr;
    do {
      *local_30 = '\0';
      std::__cxx11::string::operator+=(in_RDI,local_40);
      local_40 = local_30 + in_RDX;
      std::__cxx11::string::operator+=(in_RDI,in_RCX);
      local_30 = strstr(local_40,in_RSI);
    } while (local_30 != (char *)0x0);
    std::__cxx11::string::operator+=(in_RDI,local_40);
    free(__ptr);
  }
  return;
}

Assistant:

void SystemToolsStatic::ReplaceString(std::string& source, const char* replace,
                                      size_t replaceSize,
                                      const std::string& with)
{
  const char* src = source.c_str();
  char* searchPos = const_cast<char*>(strstr(src, replace));

  // get out quick if string is not found
  if (!searchPos) {
    return;
  }

  // perform replacements until done
  char* orig = strdup(src);
  char* currentPos = orig;
  searchPos = searchPos - src + orig;

  // initialize the result
  source.erase(source.begin(), source.end());
  do {
    *searchPos = '\0';
    source += currentPos;
    currentPos = searchPos + replaceSize;
    // replace
    source += with;
    searchPos = strstr(currentPos, replace);
  } while (searchPos);

  // copy any trailing text
  source += currentPos;
  free(orig);
}